

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

void __thiscall
google::protobuf::
MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue>
::MapPair(MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue>
          *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *other_first)

{
  std::__cxx11::string::string((string *)this,(string *)other_first);
  CoreML::Specification::CustomLayerParams_CustomLayerParamValue::
  CustomLayerParams_CustomLayerParamValue(&this->second);
  return;
}

Assistant:

explicit MapPair(const Key& other_first) : first(other_first), second() {}